

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

void nn_timer_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  if (type == -3 && src == -2) {
    *(undefined4 *)&self[1].fn = 3;
    nn_worker_execute((nn_worker *)self[2].ctx,(nn_worker_task *)&self[1].owner);
    return;
  }
  if (*(int *)&self[1].fn == 3) {
    if (src != 2) {
      return;
    }
    if (type == 1) {
      nn_worker_rm_timer((nn_worker *)self[2].ctx,(nn_worker_timer *)&self[1].stopped.src);
      *(undefined4 *)&self[1].fn = 1;
      nn_fsm_stopped(self,2);
      return;
    }
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","type == NN_WORKER_TASK_EXECUTE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/aio/timer.c"
            ,0x69);
  }
  else {
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state");
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_timer_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_timer *timer;

    timer = nn_cont (self, struct nn_timer, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        timer->state = NN_TIMER_STATE_STOPPING;
        nn_worker_execute (timer->worker, &timer->stop_task);
        return;
    }
    if (nn_slow (timer->state == NN_TIMER_STATE_STOPPING)) {
        if (src != NN_TIMER_SRC_STOP_TASK)
            return;
        nn_assert (type == NN_WORKER_TASK_EXECUTE);
        nn_worker_rm_timer (timer->worker, &timer->wtimer);
        timer->state = NN_TIMER_STATE_IDLE;
        nn_fsm_stopped (&timer->fsm, NN_TIMER_STOPPED);
        return;
    }

    nn_fsm_bad_state(timer->state, src, type);
}